

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O0

bool wallet::IsSQLiteFile(path *path)

{
  bool bVar1;
  byte bVar2;
  __type_conflict _Var3;
  ulong uVar4;
  int *piVar5;
  path *in_RDI;
  long in_FS_OFFSET;
  uintmax_t size;
  error_code ec;
  char app_id [4];
  string magic_str;
  char magic [16];
  ifstream file;
  undefined4 in_stack_fffffffffffffc78;
  openmode in_stack_fffffffffffffc7c;
  char *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  error_code *in_stack_fffffffffffffc90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  LogFlags in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffcec;
  bool local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1 [9];
  ConstevalFormatString<3U> in_stack_fffffffffffffd28;
  string_view in_stack_fffffffffffffd30;
  string_view in_stack_fffffffffffffd40;
  int local_2ac [17];
  undefined1 local_268 [24];
  char local_250 [112];
  Level in_stack_fffffffffffffe20;
  char (*in_stack_fffffffffffffe30) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> local_48 [2];
  error_code local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  if (bVar1) {
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    uVar4 = std::filesystem::file_size(in_RDI,(error_code *)&stack0xfffffffffffffd40);
    bVar1 = std::error_code::operator_cast_to_bool
                      ((error_code *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffc90);
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffc80);
      in_stack_fffffffffffffc98 = local_48;
      in_stack_fffffffffffffc90 = local_28;
      in_stack_fffffffffffffc88 = "IsSQLiteFile";
      in_stack_fffffffffffffc80 = "%s: %s %s\n";
      in_stack_fffffffffffffc78 = 2;
      LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd30,in_stack_fffffffffffffcec,
                 in_stack_fffffffffffffce0,in_stack_fffffffffffffe20,in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    }
    if (uVar4 < 0x200) {
      local_2e3 = false;
    }
    else {
      std::ifstream::ifstream<fs::path,fs::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc88,
                 (path *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      bVar2 = std::ifstream::is_open();
      if ((bVar2 & 1) == 0) {
        local_2e3 = false;
      }
      else {
        std::istream::read(local_250,(long)local_268);
        std::istream::seekg((long)local_250,0x44);
        std::istream::read(local_250,(long)local_2ac);
        std::ifstream::close();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   (size_type)in_stack_fffffffffffffc98,(allocator<char> *)in_stack_fffffffffffffc90
                  );
        std::allocator<char>::~allocator(local_2e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
                   (size_type)in_stack_fffffffffffffc98,(allocator<char> *)in_stack_fffffffffffffc90
                  );
        _Var3 = std::operator==(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        std::allocator<char>::~allocator(&local_2e2);
        if (((_Var3 ^ 0xffU) & 1) == 0) {
          Params();
          CChainParams::MessageStart
                    ((CChainParams *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          piVar5 = (int *)std::array<unsigned_char,_4UL>::data
                                    ((array<unsigned_char,_4UL> *)
                                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          local_2e3 = *piVar5 == local_2ac[0];
        }
        else {
          local_2e3 = false;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      std::ifstream::~ifstream(local_250);
    }
  }
  else {
    local_2e3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2e3;
}

Assistant:

bool IsSQLiteFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A SQLite Database file is at least 512 bytes.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 512) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    // Magic is at beginning and is 16 bytes long
    char magic[16];
    file.read(magic, 16);

    // Application id is at offset 68 and 4 bytes long
    file.seekg(68, std::ios::beg);
    char app_id[4];
    file.read(app_id, 4);

    file.close();

    // Check the magic, see https://sqlite.org/fileformat.html
    std::string magic_str(magic, 16);
    if (magic_str != std::string{"SQLite format 3\000", 16}) {
        return false;
    }

    // Check the application id matches our network magic
    return memcmp(Params().MessageStart().data(), app_id, 4) == 0;
}